

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

int green_future_done(green_future_t future)

{
  bool local_19;
  green_future_t future_local;
  
  if (future == (green_future_t)0x0) {
    future_local._4_4_ = 1;
  }
  else {
    if (future->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x253);
      fflush(_stderr);
      abort();
    }
    local_19 = true;
    if (future->state != green_future_complete) {
      local_19 = future->state == green_future_aborted;
    }
    future_local._4_4_ = (uint)local_19;
  }
  return future_local._4_4_;
}

Assistant:

int green_future_done(green_future_t future)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);
    return (future->state == green_future_complete) ||
           (future->state == green_future_aborted);
}